

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O2

void duckdb::RemapEntry::PerformRemap
               (string *remap_target,Value *remap_val,case_insensitive_map_t<RemapIndex> *source_map
               ,case_insensitive_map_t<RemapIndex> *target_map,
               case_insensitive_map_t<RemapEntry> *result)

{
  LogicalTypeId LVar1;
  char cVar2;
  char cVar3;
  _Alloc_hider __p;
  bool bVar4;
  vector<duckdb::Value,_true> *this;
  iterator iVar5;
  iterator iVar6;
  child_list_t<LogicalType> *this_00;
  const_reference remap_target_00;
  const_reference pvVar7;
  type source_map_00;
  type target_map_00;
  type result_00;
  BinderException *pBVar8;
  idx_t child_idx;
  ulong __n;
  allocator local_161;
  RemapEntry remap;
  string local_120;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
  local_100;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_f8;
  vector<duckdb::Value,_true> *local_f0;
  string remap_source;
  LogicalType local_c8;
  Value struct_val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  remap_source._M_dataplus._M_p = (pointer)&remap_source.field_2;
  remap_source._M_string_length = 0;
  remap_source.field_2._M_local_buf[0] = '\0';
  local_f8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)result;
  LogicalType::LogicalType(&local_c8,SQLNULL);
  Value::Value(&struct_val,&local_c8);
  LogicalType::~LogicalType(&local_c8);
  LVar1 = (remap_val->type_).id_;
  if (LVar1 == STRUCT) {
    bVar4 = StructType::IsUnnamed(&remap_val->type_);
    if (!bVar4) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&remap,"Remap keys for remap_struct needs to be an unnamed struct",
                 (allocator *)&local_120);
      BinderException::BinderException(pBVar8,(string *)&remap);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this = StructValue::GetChildren(remap_val);
    if ((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start != 0x80) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&remap,"Remap keys for remap_struct needs to have two children",
                 (allocator *)&local_120);
      BinderException::BinderException(pBVar8,(string *)&remap);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<duckdb::Value,_true>::get<true>(this,0);
    if ((pvVar7->type_).id_ != VARCHAR) {
LAB_018677db:
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&remap,"Remap keys for remap_struct need to be varchar and struct",
                 (allocator *)&local_120);
      BinderException::BinderException(pBVar8,(string *)&remap);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<duckdb::Value,_true>::get<true>(this,1);
    if ((pvVar7->type_).id_ != STRUCT) goto LAB_018677db;
    pvVar7 = vector<duckdb::Value,_true>::get<true>(this,0);
    Value::ToString_abi_cxx11_((string *)&remap,pvVar7);
    ::std::__cxx11::string::operator=((string *)&remap_source,(string *)&remap);
    ::std::__cxx11::string::~string((string *)&remap);
    pvVar7 = vector<duckdb::Value,_true>::get<true>(this,1);
    Value::operator=(&struct_val,pvVar7);
  }
  else {
    if (LVar1 != VARCHAR) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&remap,"Remap keys for remap_struct needs to be a string or struct",
                 (allocator *)&local_120);
      BinderException::BinderException(pBVar8,(string *)&remap);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::ToString_abi_cxx11_((string *)&remap,remap_val);
    ::std::__cxx11::string::operator=((string *)&remap_source,(string *)&remap);
    ::std::__cxx11::string::~string((string *)&remap);
  }
  iVar5 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&source_map->_M_h,&remap_source);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&remap,"Source value %s not found",(allocator *)&local_120);
    ::std::__cxx11::string::string((string *)&local_50,(string *)&remap_source);
    BinderException::BinderException<std::__cxx11::string>(pBVar8,(string *)&remap,&local_50);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar6 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&target_map->_M_h,remap_target);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&remap,"Target value %s not found",(allocator *)&local_120);
    ::std::__cxx11::string::string((string *)&local_70,(string *)remap_target);
    BinderException::BinderException<std::__cxx11::string>(pBVar8,(string *)&remap,&local_70);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  cVar2 = *(char *)((long)iVar5.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                          ._M_cur + 0x30);
  cVar3 = *(char *)((long)iVar6.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                          ._M_cur + 0x30);
  RemapEntry(&remap);
  local_100 = iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
              ._M_cur;
  optional_idx::optional_idx
            ((optional_idx *)&local_120,
             *(idx_t *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                              ._M_cur + 0x28));
  remap.index.index = (idx_t)local_120._M_dataplus._M_p;
  LogicalType::operator=
            (&remap.target_type,
             (LogicalType *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                    ._M_cur + 0x30));
  if (cVar2 == 'd' || cVar3 == 'd') {
    if (((cVar2 != 'd') || (cVar3 != 'd')) || (struct_val.is_null == true)) {
LAB_0186778d:
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_120,"Structs require nested remaps",&local_161);
      BinderException::BinderException(pBVar8,&local_120);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<std::unordered_map<std::__cxx11::string,duckdb::RemapEntry,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>>>
              ();
    __p._M_p = local_120._M_dataplus._M_p;
    local_120._M_dataplus._M_p = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>_>
             *)&remap.child_remaps,(pointer)__p._M_p);
    ::std::
    unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>_>
                   *)&local_120);
    this_00 = StructType::GetChildTypes_abi_cxx11_(&struct_val.type_);
    local_f0 = StructValue::GetChildren(&struct_val);
    local_100._M_cur =
         (__node_type *)
         ((long)&((local_100._M_cur)->
                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>
                 ._M_storage._M_storage + 0x40);
    for (__n = 0; __n < (ulong)(((long)(this_00->
                                       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                       ).
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->
                                      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                      ).
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x38);
        __n = __n + 1) {
      remap_target_00 =
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
           ::get<true>(this_00,__n);
      pvVar7 = vector<duckdb::Value,_true>::get<true>(local_f0,__n);
      source_map_00 =
           unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
           ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
                        *)local_100._M_cur);
      target_map_00 =
           unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
           ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
                        *)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                                 ._M_cur + 0x48));
      result_00 = unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>,_true>
                  ::operator*(&remap.child_remaps);
      PerformRemap(&remap_target_00->first,pvVar7,source_map_00,target_map_00,result_00);
    }
  }
  else if (struct_val.is_null == false) goto LAB_0186778d;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,duckdb::RemapEntry>(local_f8,remap_target,&remap);
  ~RemapEntry(&remap);
  Value::~Value(&struct_val);
  ::std::__cxx11::string::~string((string *)&remap_source);
  return;
}

Assistant:

static void PerformRemap(const string &remap_target, const Value &remap_val,
	                         case_insensitive_map_t<RemapIndex> &source_map,
	                         case_insensitive_map_t<RemapIndex> &target_map,
	                         case_insensitive_map_t<RemapEntry> &result) {
		string remap_source;
		Value struct_val;
		if (remap_val.type().id() == LogicalTypeId::VARCHAR) {
			remap_source = remap_val.ToString();
		} else if (remap_val.type().id() == LogicalTypeId::STRUCT) {
			if (!StructType::IsUnnamed(remap_val.type())) {
				throw BinderException("Remap keys for remap_struct needs to be an unnamed struct");
			}
			auto &children = StructValue::GetChildren(remap_val);
			if (children.size() != 2) {
				throw BinderException("Remap keys for remap_struct needs to have two children");
			}
			if (children[0].type().id() != LogicalTypeId::VARCHAR || children[1].type().id() != LogicalTypeId::STRUCT) {
				throw BinderException("Remap keys for remap_struct need to be varchar and struct");
			}
			remap_source = children[0].ToString();
			struct_val = children[1];
		} else {
			throw BinderException("Remap keys for remap_struct needs to be a string or struct");
		}

		// find the source index
		auto entry = source_map.find(remap_source);
		if (entry == source_map.end()) {
			throw BinderException("Source value %s not found", remap_source);
		}
		auto target_entry = target_map.find(remap_target);
		if (target_entry == target_map.end()) {
			throw BinderException("Target value %s not found", remap_target);
		}
		bool source_is_struct = entry->second.type.id() == LogicalTypeId::STRUCT;
		bool target_is_struct = target_entry->second.type.id() == LogicalTypeId::STRUCT;
		RemapEntry remap;
		remap.index = entry->second.index;
		remap.target_type = target_entry->second.type;
		if (source_is_struct || target_is_struct || !struct_val.IsNull()) {
			// this is a struct - we actually need all 3 of these to be true (or none of them to be true)
			if (!source_is_struct || !target_is_struct || struct_val.IsNull()) {
				throw BinderException("Structs require nested remaps");
			}
			remap.child_remaps = make_uniq<case_insensitive_map_t<RemapEntry>>();
			auto &remap_types = StructType::GetChildTypes(struct_val.type());
			auto &remap_values = StructValue::GetChildren(struct_val);
			for (idx_t child_idx = 0; child_idx < remap_types.size(); child_idx++) {
				PerformRemap(remap_types[child_idx].first, remap_values[child_idx], *entry->second.child_map,
				             *target_entry->second.child_map, *remap.child_remaps);
			}
		}
		result.emplace(remap_target, std::move(remap));
	}